

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void __thiscall vw::vw(vw *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  shared_data *psVar3;
  long lVar4;
  
  (this->parse_thread)._M_id._M_thread = 0;
  (this->data_filename)._M_dataplus._M_p = (pointer)&(this->data_filename).field_2;
  (this->data_filename)._M_string_length = 0;
  (this->data_filename).field_2._M_local_buf[0] = '\0';
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->model_file_ver).major = 0;
  (this->model_file_ver).minor = 0;
  (this->model_file_ver).rev = 0;
  this->vw_is_main = false;
  vw_ostream::vw_ostream(&this->trace_message);
  this->should_delete_options = false;
  (this->initial_regressors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->initial_regressors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->initial_regressors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->feature_mask)._M_dataplus._M_p = (pointer)&(this->feature_mask).field_2;
  (this->feature_mask)._M_string_length = 0;
  (this->feature_mask).field_2._M_local_buf[0] = '\0';
  (this->per_feature_regularizer_input)._M_dataplus._M_p =
       (pointer)&(this->per_feature_regularizer_input).field_2;
  (this->per_feature_regularizer_input)._M_string_length = 0;
  (this->per_feature_regularizer_input).field_2._M_local_buf[0] = '\0';
  (this->per_feature_regularizer_output)._M_dataplus._M_p =
       (pointer)&(this->per_feature_regularizer_output).field_2;
  (this->per_feature_regularizer_output)._M_string_length = 0;
  (this->per_feature_regularizer_output).field_2._M_local_buf[0] = '\0';
  (this->per_feature_regularizer_text)._M_dataplus._M_p =
       (pointer)&(this->per_feature_regularizer_text).field_2;
  (this->per_feature_regularizer_text)._M_string_length = 0;
  (this->per_feature_regularizer_text).field_2._M_local_buf[0] = '\0';
  (this->limit_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->limit_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->limit_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->interactions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interactions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skip_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skip_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ngram_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->skip_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_strings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&this->dictionary_path,0,0x1830);
  (this->text_regressor_name)._M_dataplus._M_p = (pointer)&(this->text_regressor_name).field_2;
  (this->text_regressor_name)._M_string_length = 0;
  (this->text_regressor_name).field_2._M_local_buf[0] = '\0';
  (this->inv_hash_regressor_name)._M_dataplus._M_p =
       (pointer)&(this->inv_hash_regressor_name).field_2;
  (this->inv_hash_regressor_name)._M_string_length = 0;
  (this->inv_hash_regressor_name).field_2._M_local_buf[0] = '\0';
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->reduction_stack).c.
  super__Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
  ::_M_initialize_map((_Deque_base<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>
                       *)&this->reduction_stack,0);
  (this->final_regressor_name)._M_dataplus._M_p = (pointer)&(this->final_regressor_name).field_2;
  (this->final_regressor_name)._M_string_length = 0;
  (this->final_regressor_name).field_2._M_local_buf[0] = '\0';
  (this->weights).dense_weights._begin = (weight *)0x0;
  (this->weights).dense_weights._weight_mask = 0;
  *(undefined8 *)((long)&(this->weights).dense_weights._weight_mask + 5) = 0;
  sparse_parameters::sparse_parameters(&(this->weights).sparse_weights);
  p_Var1 = &(this->name_index_map)._M_t._M_impl.super__Rb_tree_header;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->name_index_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar3 = calloc_or_throw<shared_data>(1);
  this->sd = psVar3;
  psVar3->dump_interval = 1.0;
  this->sd->contraction = 1.0;
  this->sd->first_observed_label = 3.4028235e+38;
  this->sd->is_more_than_two_labels_observed = false;
  this->sd->max_label = 0.0;
  this->sd->min_label = 0.0;
  this->label_type = simple;
  this->loss = (loss_function *)0x0;
  this->reg_mode = 0;
  this->current_pass = 0;
  this->l = (base_learner *)0x0;
  this->scorer = (single_learner *)0x0;
  this->cost_sensitive = (base_learner *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->data_filename,0,(char *)(this->data_filename)._M_string_length,0x279855);
  this->delete_prediction = (_func_void_void_ptr *)0x0;
  this->bfgs = false;
  this->hessian_on = false;
  this->save_resume = false;
  this->preserve_performance_counters = false;
  this->no_bias = false;
  this->active = false;
  this->num_bits = 0x12;
  this->default_bits = true;
  this->daemon = false;
  this->num_children = 10;
  this->random_positive_weights = false;
  (this->weights).sparse = false;
  this->set_minmax = set_mm;
  this->power_t = 0.5;
  this->eta = 0.5;
  this->numpasses = 1;
  (this->final_prediction_sink)._begin = (int *)0x0;
  (this->final_prediction_sink)._end = (int *)0x0;
  (this->final_prediction_sink).end_array = (int *)0x0;
  this->raw_prediction = -1;
  this->print = print_result;
  this->print_text = print_raw_text;
  this->lda = 0;
  this->random_seed = 0;
  this->random_weights = false;
  this->normal_weights = false;
  this->tnormal_weights = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this->per_feature_regularizer_input,0,
             (char *)(this->per_feature_regularizer_input)._M_string_length,0x279855);
  std::__cxx11::string::_M_replace
            ((ulong)&this->per_feature_regularizer_output,0,
             (char *)(this->per_feature_regularizer_output)._M_string_length,0x279855);
  std::__cxx11::string::_M_replace
            ((ulong)&this->per_feature_regularizer_text,0,
             (char *)(this->per_feature_regularizer_text)._M_string_length,0x279855);
  iVar2 = fileno(_stdout);
  this->stdout_fileno = iVar2;
  this->searchstr = (void *)0x0;
  this->nonormalize = false;
  this->l1_lambda = 0.0;
  this->l2_lambda = 0.0;
  this->eta_decay_rate = 1.0;
  this->initial_weight = 0.0;
  this->initial_constant = 0.0;
  this->all_reduce = (AllReduce *)0x0;
  memset(this->ngram,0,0x800);
  lVar4 = 0x1b00;
  do {
    *(undefined4 *)((long)this + lVar4 * 4 + -0x5d00) = 0x7fffffff;
    *(undefined8 *)((long)this + lVar4 * 8 + -0xc500) = 0;
    *(undefined1 *)((long)&this->sd + lVar4) = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1c00);
  this->adaptive = true;
  this->normalized_updates = true;
  this->invariant_updates = true;
  this->normalized_idx = 2;
  this->add_constant = true;
  this->audit = false;
  this->pass_length = 0xffffffffffffffff;
  this->passes_complete = 0;
  this->save_per_pass = false;
  this->stdin_off = false;
  this->do_reset_source = false;
  this->holdout_set_off = true;
  this->holdout_after = 0;
  this->check_holdout_every_n_passes = 1;
  this->early_terminate = false;
  this->max_examples = 0xffffffffffffffff;
  this->hash_inv = false;
  this->print_invert = false;
  this->progress_add = false;
  this->progress_arg = 2.0;
  this->sd->is_more_than_two_labels_observed = false;
  this->sd->first_observed_label = 3.4028235e+38;
  this->sd->second_observed_label = 3.4028235e+38;
  this->sd->report_multiclass_log_loss = false;
  this->sd->multiclass_log_loss = 0.0;
  this->sd->holdout_multiclass_log_loss = 0.0;
  return;
}

Assistant:

vw::vw()
{
  sd = &calloc_or_throw<shared_data>();
  sd->dump_interval = 1.;  // next update progress dump
  sd->contraction = 1.;
  sd->first_observed_label = FLT_MAX;
  sd->is_more_than_two_labels_observed = false;
  sd->max_label = 0;
  sd->min_label = 0;

  label_type = label_type::simple;

  l = nullptr;
  scorer = nullptr;
  cost_sensitive = nullptr;
  loss = nullptr;

  reg_mode = 0;
  current_pass = 0;

  data_filename = "";
  delete_prediction = nullptr;

  bfgs = false;
  no_bias = false;
  hessian_on = false;
  active = false;
  num_bits = 18;
  default_bits = true;
  daemon = false;
  num_children = 10;
  save_resume = false;
  preserve_performance_counters = false;

  random_positive_weights = false;

  weights.sparse = false;

  set_minmax = set_mm;

  power_t = 0.5;
  eta = 0.5;  // default learning rate for normalized adaptive updates, this is switched to 10 by default for the other
              // updates (see parse_args.cc)
  numpasses = 1;

  final_prediction_sink.begin() = final_prediction_sink.end() = final_prediction_sink.end_array = nullptr;
  raw_prediction = -1;
  print = print_result;
  print_text = print_raw_text;
  lda = 0;
  random_seed = 0;
  random_weights = false;
  normal_weights = false;
  tnormal_weights = false;
  per_feature_regularizer_input = "";
  per_feature_regularizer_output = "";
  per_feature_regularizer_text = "";

#ifdef _WIN32
  stdout_fileno = _fileno(stdout);
#else
  stdout_fileno = fileno(stdout);
#endif

  searchstr = nullptr;

  nonormalize = false;
  l1_lambda = 0.0;
  l2_lambda = 0.0;

  eta_decay_rate = 1.0;
  initial_weight = 0.0;
  initial_constant = 0.0;

  all_reduce = nullptr;

  for (size_t i = 0; i < 256; i++)
  {
    ngram[i] = 0;
    skips[i] = 0;
    limit[i] = INT_MAX;
    affix_features[i] = 0;
    spelling_features[i] = 0;
  }

  // by default use invariant normalized adaptive updates
  adaptive = true;
  normalized_updates = true;
  invariant_updates = true;
  normalized_idx = 2;

  add_constant = true;
  audit = false;

  pass_length = (size_t)-1;
  passes_complete = 0;

  save_per_pass = false;

  stdin_off = false;
  do_reset_source = false;
  holdout_set_off = true;
  holdout_after = 0;
  check_holdout_every_n_passes = 1;
  early_terminate = false;

  max_examples = (size_t)-1;

  hash_inv = false;
  print_invert = false;

  // Set by the '--progress <arg>' option and affect sd->dump_interval
  progress_add = false;  // default is multiplicative progress dumps
  progress_arg = 2.0;    // next update progress dump multiplier

  sd->is_more_than_two_labels_observed = false;
  sd->first_observed_label = FLT_MAX;
  sd->second_observed_label = FLT_MAX;

  sd->report_multiclass_log_loss = false;
  sd->multiclass_log_loss = 0;
  sd->holdout_multiclass_log_loss = 0;
}